

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void * buffer_insert_raw(BUFFER *buf,size_t off,size_t n)

{
  int iVar1;
  size_t in_RDX;
  BUFFER *in_RSI;
  BUFFER *in_RDI;
  void *local_8;
  
  if ((in_RDI->alloc < in_RDI->size + in_RDX) && (iVar1 = buffer_reserve(in_RSI,in_RDX), iVar1 != 0)
     ) {
    local_8 = (void *)0x0;
  }
  else {
    if (in_RSI < (BUFFER *)in_RDI->size) {
      memmove((void *)((long)&in_RSI->data + in_RDX + (long)in_RDI->data),
              (void *)((long)&in_RSI->data + (long)in_RDI->data),in_RDI->size - (long)in_RSI);
    }
    in_RDI->size = in_RDX + in_RDI->size;
    local_8 = buffer_data_at(in_RDI,(size_t)in_RSI);
  }
  return local_8;
}

Assistant:

void*
buffer_insert_raw(BUFFER* buf, size_t off, size_t n)
{
    if(buf->size + n > buf->alloc) {
        if(buffer_reserve(buf, n) != 0)
            return NULL;
    }

    if(buf->size > off)
        memmove((uint8_t*)buf->data + off + n, (uint8_t*)buf->data + off, buf->size - off);

    buf->size += n;
    return buffer_data_at(buf, off);
}